

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp-getelement.cpp
# Opt level: O3

IdentIndex ICM::insertGlobalDyVarbIdentIndex(string *name)

{
  IndexTable<unsigned_long,_ICM::IdentTableUnit> *this;
  size_t sVar1;
  size_t local_30;
  IdentTableUnit local_28;
  
  local_30 = Common::
             SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[]((SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)Compiler::GlobalIdentNameMap_abi_cxx11_,name);
  if (DAT_00153800 != DAT_001537f8) {
    this = *(IndexTable<unsigned_long,_ICM::IdentTableUnit> **)(DAT_001537f8 + 0x10);
    local_28.type = I_DyVarb;
    local_28.index = 0;
    local_28.field_3.StVarb = (Object *)(Static + 0x10);
    local_28.field_2.dimtype = 3;
    sVar1 = Common::IndexTable<unsigned_long,_ICM::IdentTableUnit>::insert(this,&local_30,&local_28)
    ;
    (this->data).super__Vector_base<ICM::IdentTableUnit,_std::allocator<ICM::IdentTableUnit>_>.
    _M_impl.super__Vector_impl_data._M_start[sVar1].index = sVar1;
    return (IdentIndex)(sVar1 << 0x20);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

IdentIndex insertGlobalDyVarbIdentIndex(const string & name) {
		return { 0, insertFromIdentTable(0, Compiler::GlobalIdentNameMap[name], I_DyVarb) };
	}